

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v8::detail::default_arg_formatter<wchar_t>::operator()
          (default_arg_formatter<wchar_t> *this,bool value)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  undefined7 in_register_00000031;
  locale_ref in_R8;
  
  bVar1.container._1_7_ = in_register_00000031;
  bVar1.container._0_1_ = value;
  bVar1 = write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_bool,_0>
                    ((this->out).container,bVar1,true,(basic_format_specs<wchar_t> *)0x0,in_R8);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }